

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.hpp
# Opt level: O2

char * __thiscall Quartet::index(Quartet *this,char *__s,int __c)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  int __c_00;
  
  pcVar2 = Doublet::index(&this->bra,__s,__c);
  iVar1 = Doublet::ncart(&this->ket);
  pcVar3 = Doublet::index(&this->ket,__s,__c_00);
  return (char *)(ulong)(uint)((int)pcVar3 + iVar1 * (int)pcVar2);
}

Assistant:

int index(void) const { return bra.index() * ket.ncart() + ket.index(); }